

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall
xLearn::DMatrix::AddNode
          (DMatrix *this,index_t row_id,index_t feat_id,real_t feat_val,index_t field_id)

{
  pointer ppvVar1;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar2;
  ostream *poVar3;
  allocator local_72;
  allocator local_71;
  Logger local_70;
  real_t local_6c;
  Node node;
  string local_48;
  
  if (row_id < this->row_length) {
    ppvVar1 = (this->row).
              super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = ppvVar1[row_id];
    if (pvVar2 == (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)0x0) {
      local_6c = feat_val;
      pvVar2 = (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)operator_new(0x18);
      *(pointer *)
       ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data + 0x10) = (pointer)0x0;
      (pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
      super__Vector_impl_data._M_start = 0;
      *(pointer *)
       ((long)&(pvVar2->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
               super__Vector_impl_data + 8) = (pointer)0x0;
      ppvVar1[row_id] = pvVar2;
      pvVar2 = (this->row).
               super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[row_id];
      feat_val = local_6c;
    }
    node.field_id = field_id;
    node.feat_id = feat_id;
    node.feat_val = feat_val;
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::push_back(pvVar2,&node);
    return;
  }
  local_70.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&node,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
             ,&local_71);
  std::__cxx11::string::string((string *)&local_48,"AddNode",&local_72);
  poVar3 = Logger::Start(ERR,(string *)&node,0xd0,&local_48);
  poVar3 = std::operator<<(poVar3,"CHECK_GT failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure.h"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd0);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"row_length");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"row_id");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&node);
  Logger::~Logger(&local_70);
  abort();
}

Assistant:

void AddNode(index_t row_id,  
               index_t feat_id,
               real_t feat_val, 
               index_t field_id = 0) {
    CHECK_GT(row_length, row_id);
    // Allocate memory for the first adding
    if (row[row_id] == nullptr) {
      row[row_id] = new SparseRow;
    }
    Node node(field_id, feat_id, feat_val);
    row[row_id]->push_back(node);
  }